

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::DrawXFBFeedback::draw(DrawXFBFeedback *this,bool is_first_draw)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  bool is_first_draw_local;
  DrawXFBFeedback *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1352);
  (**(code **)(lVar4 + 0x30))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1355);
  if (is_first_draw) {
    (**(code **)(lVar4 + 0x538))(0,0,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glDrawArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x135a);
  }
  else {
    (**(code **)(lVar4 + 0x5b0))(0,this->m_xfb_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glDrawTransformFeedback call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x135f);
  }
  (**(code **)(lVar4 + 0x638))();
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1363);
  (**(code **)(lVar4 + 0x4e8))(0x8c89);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDisable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1366);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBFeedback::draw(bool is_first_draw)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	if (is_first_draw)
	{
		gl.drawArrays(GL_POINTS, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");
	}
	else
	{
		gl.drawTransformFeedback(GL_POINTS, m_xfb_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawTransformFeedback call failed.");
	}

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable call failed.");
}